

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseDocType(TidyDocImpl *doc,TidyOptionImpl *option)

{
  tchar tVar1;
  tchar c;
  TidyConfigImpl *cfg;
  uint value;
  Bool status;
  TidyOptionImpl *option_local;
  TidyDocImpl *doc_local;
  
  cfg._4_4_ = 1;
  _value = option;
  option_local = (TidyOptionImpl *)doc;
  if ((doc->config).c == 0xffffffff) {
    SetOptionValue(doc,option->id,(ctmbstr)0x0);
    doc_local._4_4_ = yes;
  }
  else {
    tVar1 = SkipWhite(&doc->config);
    if ((((tVar1 == 0x22) || (tVar1 == 0x27)) || (tVar1 == 0x2d)) || (tVar1 == 0x2b)) {
      cfg._4_4_ = ParseString((TidyDocImpl *)option_local,_value);
      if (cfg._4_4_ != no) {
        prvTidySetOptionInt((TidyDocImpl *)option_local,TidyDoctypeMode,5);
      }
      doc_local._4_4_ = cfg._4_4_;
    }
    else {
      cfg._4_4_ = GetParsePickListValue((TidyDocImpl *)option_local,_value,(uint *)&cfg);
      if (cfg._4_4_ == no) {
        prvTidyReportBadArgument((TidyDocImpl *)option_local,_value->name);
      }
      else {
        prvTidySetOptionInt((TidyDocImpl *)option_local,TidyDoctypeMode,(ulong)(uint)cfg);
      }
      doc_local._4_4_ = cfg._4_4_;
    }
  }
  return doc_local._4_4_;
}

Assistant:

Bool ParseDocType( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    Bool status = yes;
    uint value;
    TidyConfigImpl* cfg = &doc->config;
    tchar c;

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
    {
        SetOptionValue( doc, option->id, NULL );
        return yes;
    }

    c = SkipWhite( cfg );


    /* "-//ACME//DTD HTML 3.14159//EN" or similar */

    if ( c == '"' || c == '\''|| c == '-' || c == '+' )
    {
        status = ParseString(doc, option);
        if (status)
        {
            TY_(SetOptionInt)( doc, TidyDoctypeMode, TidyDoctypeUser );
        }
        return status;
    }
    
    if ( (status = GetParsePickListValue( doc, option, &value ) ) )
    {
        TY_(SetOptionInt)( doc, TidyDoctypeMode, value );
    }
    else
    {
        TY_(ReportBadArgument)( doc, option->name );
    }
    
    return status;
}